

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeZeroObjVariablePS::FreeZeroObjVariablePS
          (FreeZeroObjVariablePS *this,FreeZeroObjVariablePS *old)

{
  int iVar1;
  int32_t iVar2;
  long lVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  byte bVar6;
  
  bVar6 = 0;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006a6da8;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar1 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar1;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeZeroObjVariablePS_006a7350;
  iVar1 = old->m_old_j;
  this->m_j = old->m_j;
  this->m_old_j = iVar1;
  this->m_old_i = old->m_old_i;
  pnVar4 = &old->m_bnd;
  pnVar5 = &this->m_bnd;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar5->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -8 + 4);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -8 + 4);
  }
  (this->m_bnd).m_backend.exp = (old->m_bnd).m_backend.exp;
  (this->m_bnd).m_backend.neg = (old->m_bnd).m_backend.neg;
  iVar2 = (old->m_bnd).m_backend.prec_elem;
  (this->m_bnd).m_backend.fpclass = (old->m_bnd).m_backend.fpclass;
  (this->m_bnd).m_backend.prec_elem = iVar2;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_col)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
  (this->m_col).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_col,
             (old->m_col).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&(old->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  (this->m_lRhs).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_lRhs).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_lRhs).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_lRhs)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
  (this->m_lRhs).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_lRhs,
             (old->m_lRhs).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_lRhs).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&(old->m_lRhs).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  (this->m_rowObj).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_rowObj).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_rowObj).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_rowObj)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
  (this->m_rowObj).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_rowObj,
             (old->m_rowObj).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_rowObj).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&(old->m_rowObj).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array(&this->m_rows,&old->m_rows);
  this->m_loFree = old->m_loFree;
  return;
}

Assistant:

FreeZeroObjVariablePS(const FreeZeroObjVariablePS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_old_j(old.m_old_j)
         , m_old_i(old.m_old_i)
         , m_bnd(old.m_bnd)
         , m_col(old.m_col)
         , m_lRhs(old.m_lRhs)
         , m_rowObj(old.m_rowObj)
         , m_rows(old.m_rows)
         , m_loFree(old.m_loFree)
      {}